

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf_hdr_t * vcf_hdr_read(htsFile *fp)

{
  kstring_t *str;
  bool bVar1;
  int iVar2;
  bcf_hdr_t *h;
  BGZF *f;
  kstream_t *ks;
  long lVar3;
  tbx_t *tbx;
  char **__ptr;
  bcf_hrec_t *pbVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  kstring_t *dret_00;
  uchar *puVar9;
  size_t sVar10;
  char *pcVar11;
  int dret;
  int n;
  undefined8 uStack_60;
  char *local_58;
  kstring_t local_48;
  
  str = &fp->line;
  h = bcf_hdr_init("r");
  local_48.s = (char *)0x0;
  local_48.l = 0;
  local_48.m = 0;
  do {
    do {
      iVar2 = hts_getline(fp,2,str);
      if (iVar2 < 0) goto LAB_00112f74;
      sVar10 = str->l;
    } while (sVar10 == 0);
    pcVar11 = (fp->line).s;
    if (*pcVar11 != '#') {
      if (1 < hts_verbose) {
        fprintf(_stderr,"[E::%s] no sample line\n","vcf_hdr_read");
      }
      free(local_48.s);
      bcf_hdr_destroy(h);
      return (bcf_hdr_t *)0x0;
    }
    if ((pcVar11[1] != '#') && (fp->fn_aux != (char *)0x0)) {
      _n = 0;
      uStack_60 = 0;
      local_58 = (char *)0x0;
      dret_00 = str;
      f = (BGZF *)gzopen(fp->fn_aux,"r");
      ks = ks_init(f);
LAB_00112e45:
      iVar2 = ks_getuntil((kstream_t_conflict *)ks,(int)&n,(kstring_t *)&dret,(int *)dret_00);
      if (-1 < iVar2) {
        kputs("##contig=<ID=",&local_48);
        kputs(local_58,&local_48);
        ks_getuntil((kstream_t_conflict *)ks,(int)&n,(kstring_t *)&dret,(int *)dret_00);
        kputs(",length=",&local_48);
        lVar3 = atol(local_58);
        kputw((int)lVar3,&local_48);
        kputsn(">\n",2,&local_48);
        if (dret != 10) {
          dret_00 = (kstring_t *)(ulong)(uint)ks->begin;
          iVar2 = ks->end;
          do {
            if (((*(uint *)&ks->field_0x8 & 3) != 0) && (iVar2 <= (int)dret_00)) break;
            puVar9 = ks->buf;
            if (iVar2 <= (int)dret_00) {
              ks->begin = 0;
              iVar2 = gzread(ks->f,puVar9,(int)*(uint *)&ks->field_0x8 >> 2);
              ks->end = iVar2;
              if (iVar2 == 0) {
                *(uint *)&ks->field_0x8 = (*(uint *)&ks->field_0x8 & 0xfffffffc) + 1;
                break;
              }
              dret_00 = (kstring_t *)(ulong)(uint)ks->begin;
              puVar9 = ks->buf;
            }
            ks->seek_pos = ks->seek_pos + 1;
            iVar7 = (int)dret_00;
            uVar8 = iVar7 + 1;
            dret_00 = (kstring_t *)(ulong)uVar8;
            ks->begin = uVar8;
          } while (puVar9[iVar7] != '\n');
        }
        goto LAB_00112e45;
      }
      free(local_58);
      ks_destroy(ks);
      gzclose(f);
      sVar10 = (fp->line).l;
      pcVar11 = (fp->line).s;
    }
    kputsn(pcVar11,(int)sVar10,&local_48);
    kputc(10,&local_48);
  } while ((fp->line).s[1] == '#');
LAB_00112f74:
  pcVar11 = local_48.s;
  if (local_48.s == (char *)0x0) {
    h = (bcf_hdr_t *)0x0;
    fprintf(_stderr,"[%s:%d %s] Could not read the header\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x4db,"vcf_hdr_read");
  }
  else {
    bcf_hdr_parse(h,local_48.s);
    tbx = tbx_index_load(fp->fn);
    if (tbx != (tbx_t *)0x0) {
      __ptr = tbx_seqnames(tbx,&n);
      bVar1 = false;
      for (lVar3 = 0; lVar3 < n; lVar3 = lVar3 + 1) {
        pbVar4 = bcf_hdr_get_hrec(h,3,"ID",__ptr[lVar3],(char *)0x0);
        if (pbVar4 == (bcf_hrec_t *)0x0) {
          pbVar4 = (bcf_hrec_t *)calloc(1,0x30);
          pcVar5 = strdup("contig");
          pbVar4->key = pcVar5;
          bcf_hrec_add_key(pbVar4,"ID",2);
          iVar2 = pbVar4->nkeys;
          pcVar5 = __ptr[lVar3];
          sVar6 = strlen(pcVar5);
          bcf_hrec_set_val(pbVar4,iVar2 + -1,pcVar5,(int)sVar6,0);
          bcf_hdr_add_hrec(h,pbVar4);
          bVar1 = true;
        }
      }
      free(__ptr);
      tbx_destroy(tbx);
      if (bVar1) {
        bcf_hdr_sync(h);
      }
    }
    free(pcVar11);
  }
  return h;
}

Assistant:

bcf_hdr_t *vcf_hdr_read(htsFile *fp)
{
    kstring_t txt, *s = &fp->line;
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    txt.l = txt.m = 0; txt.s = 0;
    while (hts_getline(fp, KS_SEP_LINE, s) >= 0) {
        if (s->l == 0) continue;
        if (s->s[0] != '#') {
            if (hts_verbose >= 2)
                fprintf(stderr, "[E::%s] no sample line\n", __func__);
            free(txt.s);
            bcf_hdr_destroy(h);
            return 0;
        }
        if (s->s[1] != '#' && fp->fn_aux) { // insert contigs here
            int dret;
            gzFile f;
            kstream_t *ks;
            kstring_t tmp;
            tmp.l = tmp.m = 0; tmp.s = 0;
            f = gzopen(fp->fn_aux, "r");
            ks = ks_init(f);
            while (ks_getuntil(ks, 0, &tmp, &dret) >= 0) {
                int c;
                kputs("##contig=<ID=", &txt); kputs(tmp.s, &txt);
                ks_getuntil(ks, 0, &tmp, &dret);
                kputs(",length=", &txt); kputw(atol(tmp.s), &txt);
                kputsn(">\n", 2, &txt);
                if (dret != '\n')
                    while ((c = ks_getc(ks)) != '\n' && c != -1); // skip the rest of the line
            }
            free(tmp.s);
            ks_destroy(ks);
            gzclose(f);
        }
        kputsn(s->s, s->l, &txt);
        kputc('\n', &txt);
        if (s->s[1] != '#') break;
    }
    if ( !txt.s )
    {
        fprintf(stderr,"[%s:%d %s] Could not read the header\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    bcf_hdr_parse(h, txt.s);

    // check tabix index, are all contigs listed in the header? add the missing ones
    tbx_t *idx = tbx_index_load(fp->fn);
    if ( idx )
    {
        int i, n, need_sync = 0;
        const char **names = tbx_seqnames(idx, &n);
        for (i=0; i<n; i++)
        {
            bcf_hrec_t *hrec = bcf_hdr_get_hrec(h, BCF_HL_CTG, "ID", (char*) names[i], NULL);
            if ( hrec ) continue;
            hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
            hrec->key = strdup("contig");
            bcf_hrec_add_key(hrec, "ID", strlen("ID"));
            bcf_hrec_set_val(hrec, hrec->nkeys-1, (char*) names[i], strlen(names[i]), 0);
            bcf_hdr_add_hrec(h, hrec);
            need_sync = 1;
        }
        free(names);
        tbx_destroy(idx);
        if ( need_sync )
            bcf_hdr_sync(h);
    }
    free(txt.s);
    return h;
}